

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_LABEL(CodeGenGenericContext *ctx,uint labelID,int invalidate)

{
  x86Instruction *pxVar1;
  
  if (invalidate != 0) {
    CodeGenGenericContext::InvalidateState(ctx);
  }
  pxVar1 = ctx->x86Op;
  pxVar1->name = o_label;
  (pxVar1->field_4).labelID = labelID;
  pxVar1 = ctx->x86Op;
  (pxVar1->argA).type = argNone;
  (pxVar1->argA).field_1.num = invalidate;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_LABEL(CodeGenGenericContext &ctx, unsigned labelID, int invalidate)
{
	if(invalidate)
		ctx.InvalidateState();

	ctx.x86Op->name = o_label;
	ctx.x86Op->labelID = labelID;
	ctx.x86Op->argA.type = x86Argument::argNone;
	ctx.x86Op->argA.num = invalidate;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}